

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int cram_byte_array_stop_decode_block
              (cram_slice *slice,cram_codec *c,cram_block *in,char *out_,int *out_size)

{
  size_t sVar1;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  uchar *puVar7;
  ulong uVar8;
  int iVar9;
  uchar uVar10;
  ulong uVar11;
  size_t __size;
  size_t sVar12;
  long lVar13;
  long lVar14;
  cram_block *pcVar15;
  uchar *__src;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  
  if (slice->block_by_id == (cram_block **)0x0) {
    uVar3 = slice->hdr->num_blocks;
    if ((int)uVar3 < 1) {
      uVar8 = 0;
      pcVar15 = (cram_block *)0x0;
    }
    else {
      uVar8 = 0;
      do {
        pcVar15 = slice->block[uVar8];
        if (((pcVar15 != (cram_block *)0x0) && (pcVar15->content_type == EXTERNAL)) &&
           (pcVar15->content_id == (c->field_6).external.type)) goto LAB_00144ff9;
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
      uVar8 = (ulong)uVar3;
    }
LAB_00144ff9:
    if ((uint)uVar8 == uVar3) {
      return -1;
    }
    if (pcVar15 == (cram_block *)0x0) {
      return -1;
    }
  }
  else {
    pcVar15 = slice->block_by_id[(c->field_6).beta.nbits];
    if (pcVar15 == (cram_block *)0x0) {
      return -(uint)(*out_size != 0);
    }
  }
  iVar9 = pcVar15->idx;
  uVar8 = (ulong)iVar9;
  iVar4 = pcVar15->uncomp_size;
  iVar5 = -1;
  if (iVar9 < iVar4) {
    __src = pcVar15->data + uVar8;
    uVar2 = (c->field_6).byte_array_stop.stop;
    uVar11 = (long)iVar4 - uVar8;
    if (uVar11 < (ulong)(*(long *)(out_ + 0x28) - *(long *)(out_ + 0x30))) {
      uVar10 = *__src;
      puVar7 = (uchar *)(*(long *)(out_ + 0x30) + *(long *)(out_ + 0x20));
      if (iVar9 != iVar4 && uVar10 != uVar2) {
        lVar14 = ~uVar8 + (long)iVar4;
        do {
          *puVar7 = uVar10;
          puVar7 = puVar7 + 1;
          uVar10 = __src[1];
          __src = __src + 1;
          if (uVar10 == uVar2) break;
          bVar16 = lVar14 != 0;
          lVar14 = lVar14 + -1;
        } while (bVar16);
      }
      iVar9 = (int)__src;
      *(long *)(out_ + 0x30) = (long)puVar7 - *(long *)(out_ + 0x20);
    }
    else {
      lVar14 = 2;
      sVar1 = 0;
      do {
        sVar12 = sVar1;
        sVar1 = sVar12 + 1;
        lVar14 = lVar14 + -2;
        if (__src[sVar12] == uVar2) break;
      } while (uVar11 != sVar12);
      uVar8 = *(ulong *)(out_ + 0x28);
      lVar13 = *(long *)(out_ + 0x30);
      if (uVar8 <= (lVar13 + sVar1) - 1) {
        do {
          auVar17._8_4_ = (int)(uVar8 >> 0x20);
          auVar17._0_8_ = uVar8;
          auVar17._12_4_ = 0x45300000;
          dVar19 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) * 1.5;
          uVar11 = (ulong)dVar19;
          __size = (long)(dVar19 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
          if (uVar8 == 0) {
            __size = 0x400;
          }
          *(size_t *)(out_ + 0x28) = __size;
          pvVar6 = realloc(*(void **)(out_ + 0x20),__size);
          *(void **)(out_ + 0x20) = pvVar6;
          uVar8 = *(ulong *)(out_ + 0x28);
          lVar13 = *(long *)(out_ + 0x30);
        } while (uVar8 <= (lVar13 + sVar1) - 1);
      }
      iVar9 = (int)__src + (int)sVar1 + -1;
      memcpy((void *)(lVar13 + *(long *)(out_ + 0x20)),__src,sVar12);
      uVar8 = *(ulong *)(out_ + 0x28);
      lVar13 = *(long *)(out_ + 0x30);
      *(size_t *)(out_ + 0x30) = lVar13 + sVar1 + -1;
      if (uVar8 <= (ulong)(lVar13 - lVar14)) {
        do {
          auVar18._8_4_ = (int)(uVar8 >> 0x20);
          auVar18._0_8_ = uVar8;
          auVar18._12_4_ = 0x45300000;
          dVar19 = ((auVar18._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) * 1.5;
          uVar11 = (ulong)dVar19;
          sVar12 = (long)(dVar19 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
          if (uVar8 == 0) {
            sVar12 = 0x400;
          }
          *(size_t *)(out_ + 0x28) = sVar12;
          pvVar6 = realloc(*(void **)(out_ + 0x20),sVar12);
          *(void **)(out_ + 0x20) = pvVar6;
          uVar8 = *(ulong *)(out_ + 0x28);
        } while (uVar8 <= (*(long *)(out_ + 0x30) + sVar1) - 1);
      }
    }
    iVar4 = *(int *)&pcVar15->data;
    *out_size = iVar9 - (pcVar15->idx + iVar4);
    pcVar15->idx = (iVar9 - iVar4) + 1;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int cram_byte_array_stop_decode_block(cram_slice *slice, cram_codec *c,
				      cram_block *in, char *out_,
				      int *out_size) {
    cram_block *b = NULL;
    cram_block *out = (cram_block *)out_;
    char *cp, *out_cp, *cp_end;
    char stop;

    if (slice->block_by_id) {
	if (!(b = slice->block_by_id[c->byte_array_stop.content_id]))
	    return *out_size?-1:0;
    } else {
	int i;
	for (i = 0; i < slice->hdr->num_blocks; i++) {
	    b = slice->block[i];
	    if (b && b->content_type == EXTERNAL &&
		b->content_id == c->byte_array_stop.content_id) {
		break;
	    }
	}
	if (i == slice->hdr->num_blocks || !b)
	    return -1;
    }

    if (b->idx >= b->uncomp_size)
	return -1;
    cp = (char *)b->data + b->idx;
    cp_end = (char *)b->data + b->uncomp_size;
    out_cp = (char *)BLOCK_END(out);

    stop = c->byte_array_stop.stop;
    if (cp_end - cp < out->alloc - out->byte) {
	while (*cp != stop && cp != cp_end)
	    *out_cp++ = *cp++;
	BLOCK_SIZE(out) = out_cp - (char *)BLOCK_DATA(out);
    } else {
	char *cp_start;
	for (cp_start = cp; *cp != stop && cp != cp_end; cp++)
	    ;
	BLOCK_APPEND(out, cp_start, cp - cp_start);
	BLOCK_GROW(out, cp - cp_start);
    }

    *out_size = cp - (char *)(b->data + b->idx);
    b->idx = cp - (char *)b->data + 1;

    return 0;
}